

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::_::ArrayJoinPromiseNodeBase::get(ArrayJoinPromiseNodeBase *this,ExceptionOrValue *output)

{
  size_t sVar1;
  Branch *pBVar2;
  long *plVar3;
  char *pcVar4;
  long lVar5;
  
  sVar1 = (this->branches).size_;
  if (sVar1 != 0) {
    pBVar2 = (this->branches).ptr;
    lVar5 = 0;
    do {
      if (this->joinBehavior == LAZY) {
        plVar3 = *(long **)((long)&(pBVar2->dependency).ptr + lVar5);
        (**(code **)(*plVar3 + 0x18))(plVar3,*(undefined8 *)((long)&pBVar2->output + lVar5));
      }
      pcVar4 = *(char **)((long)&pBVar2->output + lVar5);
      if ((*pcVar4 == '\x01') && ((output->exception).ptr.isSet == false)) {
        Exception::Exception(&(output->exception).ptr.field_1.value,(Exception *)(pcVar4 + 8));
        (output->exception).ptr.isSet = true;
      }
      lVar5 = lVar5 + 0x58;
    } while (sVar1 * 0x58 - lVar5 != 0);
  }
  if ((output->exception).ptr.isSet != false) {
    return;
  }
  (*(this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember[5])(this,output);
  return;
}

Assistant:

void ArrayJoinPromiseNodeBase::get(ExceptionOrValue& output) noexcept {
  for (auto& branch: branches) {
    if (joinBehavior == ArrayJoinBehavior::LAZY) {
      // This implements `joinPromises()`'s lazy evaluation semantics.
      branch.dependency->get(branch.output);
    }

    // If any of the elements threw exceptions, propagate them.
    KJ_IF_SOME(exception, branch.output.exception) {
      output.addException(kj::mv(exception));
    }
  }

  // We either failed fast, or waited for all promises.
  KJ_DASSERT(countLeft == 0 || output.exception != kj::none);

  if (output.exception == kj::none) {
    // No errors.  The template subclass will need to fill in the result.
    getNoError(output);
  }
}